

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  scale loaded_scale;
  ifstream test_scale;
  scale local_228;
  ifstream local_210 [520];
  
  std::ifstream::ifstream(local_210);
  std::ifstream::open((char *)local_210,0x120020);
  scala::read_scl(&local_228,local_210);
  if ((long)local_228.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_228.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>.
            _M_impl.super__Vector_impl_data._M_start != 0x18) {
    __assert_fail("loaded_scale.get_scale_length() == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/mixed.cpp"
                  ,0x13,"int main(int, char **)");
  }
  if (((local_228.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
        super__Vector_impl_data._M_start)->ratio != 1.0) ||
     (NAN((local_228.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>.
           _M_impl.super__Vector_impl_data._M_start)->ratio))) {
    __assert_fail("loaded_scale.get_ratio(0) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/mixed.cpp"
                  ,0x14,"int main(int, char **)");
  }
  if ((local_228.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
       super__Vector_impl_data._M_start[1].ratio != 1.122462048309373) ||
     (NAN(local_228.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>.
          _M_impl.super__Vector_impl_data._M_start[1].ratio))) {
    __assert_fail("loaded_scale.get_ratio(1) == pow(2.0, 1.0/6.0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/mixed.cpp"
                  ,0x15,"int main(int, char **)");
  }
  if ((local_228.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
       super__Vector_impl_data._M_start[2].ratio == 2.0) &&
     (!NAN(local_228.degrees.super__Vector_base<scala::degree,_std::allocator<scala::degree>_>.
           _M_impl.super__Vector_impl_data._M_start[2].ratio))) {
    std::ifstream::close();
    scala::scale::~scale(&local_228);
    std::ifstream::~ifstream(local_210);
    return 0;
  }
  __assert_fail("loaded_scale.get_ratio(2) == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/mixed.cpp"
                ,0x16,"int main(int, char **)");
}

Assistant:

int main(int, char**) {
    ifstream test_scale; 
    test_scale.open("scales/mixed.scl");
    scala::scale loaded_scale = scala::read_scl(test_scale);

    /*
       Load a scale that has both cents and ratios.
    */

    assert(loaded_scale.get_scale_length() == 3);                // Note that we add the first degree explicitly.
    assert(loaded_scale.get_ratio(0) == 1);                  // Implicit. It's always 1
    assert(loaded_scale.get_ratio(1) == pow(2.0, 1.0/6.0));  // 200 cents is the sixth root of 2 
    assert(loaded_scale.get_ratio(2) == 2);                  // Defined in scale as 2/1
    test_scale.close();
    return 0;
}